

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

void __thiscall HMISong::ProcessInitialMetaEvents(HMISong *this)

{
  TrackInfo *pTVar1;
  BYTE BVar2;
  BYTE *pBVar3;
  size_t sVar4;
  DWORD DVar5;
  ulong uVar6;
  ulong uVar7;
  int i;
  long lVar8;
  
  for (lVar8 = 0; lVar8 < this->NumTracks; lVar8 = lVar8 + 1) {
    pTVar1 = this->Tracks + lVar8;
    uVar7 = this->Tracks[lVar8].TrackP;
    while ((((uVar6 = pTVar1->MaxTrackP - 4, pTVar1->Finished == false && (uVar7 < uVar6)) &&
            (pBVar3 = pTVar1->TrackBegin, pBVar3[uVar7] == '\0')) && (pBVar3[uVar7 + 1] == 0xff))) {
      BVar2 = pBVar3[uVar7 + 2];
      pTVar1->TrackP = uVar7 + 3;
      DVar5 = (*this->ReadVarLen)(pTVar1);
      sVar4 = pTVar1->TrackP;
      uVar7 = sVar4 + DVar5;
      if (uVar7 <= pTVar1->MaxTrackP) {
        if (BVar2 == 'Q') {
          pBVar3 = pTVar1->TrackBegin;
          MIDIStreamer::SetTempo
                    (&this->super_MIDIStreamer,
                     (uint)pBVar3[sVar4 + 2] |
                     (uint)pBVar3[sVar4 + 1] << 8 | (uint)pBVar3[sVar4] << 0x10);
          uVar7 = (ulong)DVar5 + pTVar1->TrackP;
        }
        else if (BVar2 == '/') {
          pTVar1->Finished = true;
        }
      }
      pTVar1->TrackP = uVar7;
    }
    if (uVar6 <= uVar7) {
      pTVar1->Finished = true;
    }
  }
  return;
}

Assistant:

void HMISong::ProcessInitialMetaEvents ()
{
	TrackInfo *track;
	int i;
	BYTE event;
	DWORD len;

	for (i = 0; i < NumTracks; ++i)
	{
		track = &Tracks[i];
		while (!track->Finished &&
				track->TrackP < track->MaxTrackP - 4 &&
				track->TrackBegin[track->TrackP] == 0 &&
				track->TrackBegin[track->TrackP+1] == 0xFF)
		{
			event = track->TrackBegin[track->TrackP+2];
			track->TrackP += 3;
			len = ReadVarLen(track);
			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					SetTempo(
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2])
					);
					break;
				}
			}
			track->TrackP += len;
		}
		if (track->TrackP >= track->MaxTrackP - 4)
		{
			track->Finished = true;
		}
	}
}